

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  Arena *this_00;
  uint uVar1;
  string *psVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = length;
  if (already_allocated < length) {
    uVar1 = already_allocated;
  }
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      std::__cxx11::string::_M_assign((string *)our_elems[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (already_allocated < length) {
    this_00 = this->arena_;
    lVar4 = 0;
    do {
      if (this_00 == (Arena *)0x0) {
        psVar2 = (string *)operator_new(0x20);
      }
      else {
        if (this_00->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation(this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
        }
        psVar2 = (string *)
                 ArenaImpl::AllocateAlignedAndAddCleanup
                           (&this_00->impl_,0x20,arena_destruct_object<std::__cxx11::string>);
      }
      *(string **)psVar2 = psVar2 + 0x10;
      *(undefined8 *)(psVar2 + 8) = 0;
      psVar2[0x10] = (string)0x0;
      std::__cxx11::string::_M_assign(psVar2);
      our_elems[already_allocated + lVar4] = psVar2;
      lVar4 = lVar4 + 1;
    } while (length - already_allocated != (int)lVar4);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(void** our_elems,
                                              void** other_elems, int length,
                                              int already_allocated) {
  // Split into two loops, over ranges [0, allocated) and [allocated, length),
  // to avoid a branch within the loop.
  for (int i = 0; i < already_allocated && i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
  Arena* arena = GetArena();
  for (int i = already_allocated; i < length; i++) {
    // Not allocated: alloc a new element first, then merge it.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        TypeHandler::NewFromPrototype(other_elem, arena);
    TypeHandler::Merge(*other_elem, new_elem);
    our_elems[i] = new_elem;
  }
}